

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteUInt32ToUtf16CharSequence
               (uint32_t number,vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  ushort local_1e;
  ushort local_1c;
  value_type_conflict1 local_1a;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_18;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *output_local;
  uint32_t number_local;
  
  local_18 = output;
  output_local._4_4_ = number;
  if (number < 0xd800) {
    local_1a = (value_type_conflict1)number;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(output,&local_1a);
  }
  else {
    for (; local_1e = (ushort)output_local._4_4_, 0xd7ff < output_local._4_4_;
        output_local._4_4_ = output_local._4_4_ >> 0xd) {
      local_1c = local_1e & 0x1fff | 0xe000;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(local_18,&local_1c);
    }
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(local_18,&local_1e);
  }
  return;
}

Assistant:

void WriteUInt32ToUtf16CharSequence(uint32_t number,
                                    std::vector<uint16_t>* output) {
  // For values in [0x0000, 0xD7FF], only use one char to encode it.
  if (number < 0xD800) {
    output->push_back(static_cast<uint16_t>(number));
    return;
  }
  // Encode into multiple chars. All except the last char will be in the range
  // [0xE000, 0xFFFF], and the last char will be in the range [0x0000, 0xD7FF].
  // Note that we don't use any value in range [0xD800, 0xDFFF] because they
  // have to come in pairs and the encoding is just more space-efficient w/o
  // them.
  while (number >= 0xD800) {
    // [0xE000, 0xFFFF] can represent 13 bits of info.
    output->push_back(static_cast<uint16_t>(0xE000 | (number & 0x1FFF)));
    number >>= 13;
  }
  output->push_back(static_cast<uint16_t>(number));
}